

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarCommon.cpp
# Opt level: O0

int __thiscall ZXing::OneD::DataBar::combins(DataBar *this,int n,int r)

{
  int i;
  int j;
  int val;
  int minDenom;
  int maxDenom;
  int r_local;
  int n_local;
  
  i = (int)this;
  if (n < i - n) {
    maxDenom = i - n;
    minDenom = n;
  }
  else {
    minDenom = i - n;
    maxDenom = n;
  }
  val = 1;
  j = 1;
  for (; maxDenom < i; i = i + -1) {
    val = i * val;
    if (j <= minDenom) {
      val = val / j;
      j = j + 1;
    }
  }
  for (; j <= minDenom; j = j + 1) {
    val = val / j;
  }
  return val;
}

Assistant:

static int combins(int n, int r)
{
	int maxDenom;
	int minDenom;
	if (n - r > r) {
		minDenom = r;
		maxDenom = n - r;
	} else {
		minDenom = n - r;
		maxDenom = r;
	}
	int val = 1;
	int j   = 1;
	for (int i = n; i > maxDenom; i--) {
		val *= i;
		if (j <= minDenom) {
			val /= j;
			j++;
		}
	}
	while (j <= minDenom) {
		val /= j;
		j++;
	}
	return val;
}